

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_delete_random(store *store)

{
  _Bool _Var1;
  uint32_t uVar2;
  object *local_20;
  object *obj;
  wchar_t num;
  wchar_t what;
  store *store_local;
  
  if (store->stock_num == '\0') {
    __assert_fail("store->stock_num > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x4f1,"void store_delete_random(struct store *)");
  }
  obj._4_4_ = Rand_div((uint)store->stock_num);
  local_20 = store->stock;
  while (obj._4_4_ != 0) {
    if (local_20 == (object *)0x0) {
      __assert_fail("obj",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                    ,0x4f9,"void store_delete_random(struct store *)");
    }
    local_20 = local_20->next;
    obj._4_4_ = obj._4_4_ - 1;
  }
  obj._0_4_ = (wchar_t)local_20->number;
  if (1 < (uint)(wchar_t)obj) {
    _Var1 = tval_is_ammo(local_20);
    if (_Var1) {
      uVar2 = Rand_div(100);
      if (((int)uVar2 < 0x32) || ((uint)(wchar_t)obj < 10)) {
        obj._0_4_ = (wchar_t)local_20->number;
      }
      else {
        uVar2 = Rand_div((uint)(wchar_t)obj / 5);
        obj._0_4_ = (uVar2 + 1) * 5 + (uint)(wchar_t)obj % 5;
      }
    }
    else {
      uVar2 = Rand_div(100);
      if ((int)uVar2 < 0x32) {
        obj._0_4_ = L'\x01';
      }
      else {
        uVar2 = Rand_div(100);
        if ((int)uVar2 < 0x32) {
          obj._0_4_ = (uint)((wchar_t)obj + L'\x01') / 2;
        }
        else {
          obj._0_4_ = (wchar_t)local_20->number;
        }
      }
      _Var1 = tval_can_have_charges(local_20);
      if (_Var1) {
        local_20->pval =
             local_20->pval - (short)(((wchar_t)obj * local_20->pval) / (int)(uint)local_20->number)
        ;
      }
    }
  }
  if ((int)(uint)local_20->number < (wchar_t)obj) {
    __assert_fail("num <= obj->number",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x51b,"void store_delete_random(struct store *)");
  }
  if (local_20->artifact != (artifact *)0x0) {
    history_lose_artifact(player,local_20->artifact);
  }
  store_delete(store,local_20,(wchar_t)obj);
  return;
}

Assistant:

static void store_delete_random(struct store *store)
{
	int what;
	int num;
	struct object *obj;

	assert(store->stock_num > 0);

	/* Pick a random slot */
	what = randint0(store->stock_num);

	/* Walk through list until we find our item */
	obj = store->stock;
	while (what--) {
		assert(obj);
		obj = obj->next;
	}

	/* Determine how many objects are in the slot */
	num = obj->number;

	/* Deal with stacks */
	if (num > 1) {
		/* Special behaviour for arrows, bolts &tc. */
		if (tval_is_ammo(obj)) {
			/* 50% of the time, destroy the entire stack */
			if (randint0(100) < 50 || num < 10)
				num = obj->number;

			/* 50% of the time, reduce the size to a multiple of 5 */
			else
				num = randint1(num / 5) * 5 + (num % 5);
		} else {
			/* 50% of the time, destroy a single object */
			if (randint0(100) < 50) num = 1;

			/* 25% of the time, destroy half the objects */
			else if (randint0(100) < 50) num = (num + 1) / 2;

			/* 25% of the time, destroy all objects */
			else num = obj->number;

			/* Hack -- decrement the total charges of staves and wands. */
			if (tval_can_have_charges(obj))
				obj->pval -= num * obj->pval / obj->number;
		}
	}

	assert (num <= obj->number);

	if (obj->artifact) {
		history_lose_artifact(player, obj->artifact);
	}

	/* Delete the item, wholly or in part */
	store_delete(store, obj, num);
}